

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O0

void stb_malloc_validate(void *p,void *parent)

{
  stb__alloc_type sVar1;
  void **p_00;
  void ***pppvVar2;
  stb__alloc *s;
  stb__nochildren *n;
  void *parent_local;
  void *p_local;
  
  if (p != (void *)0x0) {
    sVar1 = stb__identify(p);
    if (sVar1 == STB__nochildren) {
      p_00 = (void **)((long)p + -0x10);
      if ((*(long *)((long)p + -8) != 0) && ((void *)**(long **)((long)p + -8) != p)) {
        __assert_fail("*n->prevn == p",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                      ,0xa31,"void stb_malloc_validate(void *, void *)");
      }
      if (*p_00 != (void *)0x0) {
        pppvVar2 = stb__prevn(*p_00);
        if (*pppvVar2 != p_00) {
          __assert_fail("*stb__prevn(n->next) == &n->next",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                        ,0xa33,"void stb_malloc_validate(void *, void *)");
        }
        stb_malloc_validate(p_00,parent);
      }
    }
    else if (sVar1 != STB__chunked) {
      if (sVar1 != STB__alloc) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                      ,0xa4a,"void stb_malloc_validate(void *, void *)");
      }
      if ((*(long *)((long)p + -0x20) != 0) && ((void *)**(long **)((long)p + -0x20) != p)) {
        __assert_fail("*s->prevn == p",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                      ,0xa3c,"void stb_malloc_validate(void *, void *)");
      }
      if (*(long *)((long)p + -0x18) != 0) {
        pppvVar2 = stb__prevn(*(void **)((long)p + -0x18));
        if (*pppvVar2 != (void **)((long)p + -0x18)) {
          __assert_fail("*stb__prevn(s->child) == &s->child",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                        ,0xa3f,"void stb_malloc_validate(void *, void *)");
        }
        stb_malloc_validate(*(void **)((long)p + -0x18),p);
      }
      if (*(long *)((long)p + -0x10) != 0) {
        pppvVar2 = stb__prevn(*(void **)((long)p + -0x10));
        if (*pppvVar2 != (void **)((long)p + -0x10)) {
          __assert_fail("*stb__prevn(s->next) == &s->next",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                        ,0xa44,"void stb_malloc_validate(void *, void *)");
        }
        stb_malloc_validate(*(void **)((long)p + -0x10),parent);
      }
    }
  }
  return;
}

Assistant:

void stb_malloc_validate(void *p, void *parent)
{
   if (p == NULL) return;

   switch(stb__identify(p)) {
      case STB__chunked:
         return;
      case STB__nochildren: {
         stb__nochildren *n = (stb__nochildren *) p - 1;
         if (n->prevn)
            assert(*n->prevn == p);
         if (n->next) {
            assert(*stb__prevn(n->next) == &n->next);
            stb_malloc_validate(n, parent);
         }
         return;
      }
      case STB__alloc: {
         stb__alloc *s = (stb__alloc *) p - 1;

         if (s->prevn)
            assert(*s->prevn == p);

         if (s->child) {
            assert(*stb__prevn(s->child) == &s->child);
            stb_malloc_validate(s->child, p);
         }

         if (s->next) {
            assert(*stb__prevn(s->next) == &s->next);
            stb_malloc_validate(s->next, parent);
         }
         return;
      }
      default:
         assert(0); /* NOTREACHED */
   }
}